

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_expression.hpp
# Opt level: O3

string * __thiscall
duckdb::ConjunctionExpression::ToString<duckdb::BoundConjunctionExpression,duckdb::Expression>
          (string *__return_storage_ptr__,ConjunctionExpression *this,
          BoundConjunctionExpression *entry)

{
  undefined8 *puVar1;
  string *psVar2;
  const_reference pvVar3;
  pointer pEVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long lVar9;
  ulong uVar10;
  size_type __n;
  string result;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string *local_60;
  ExpressionType *local_58;
  string local_50;
  
  local_58 = &this[1].super_ParsedExpression.super_BaseExpression.type;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)local_58,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_100);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x1e0f04c);
  local_c0 = &local_b0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_b0 = *plVar7;
    lStack_a8 = plVar5[3];
  }
  else {
    local_b0 = *plVar7;
    local_c0 = (long *)*plVar5;
  }
  lVar9 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_b8 = lVar9;
  local_60 = __return_storage_ptr__;
  if (local_100 != &local_f0) {
    operator_delete(local_100);
    lVar9 = extraout_RDX;
  }
  if (8 < (ulong)((long)this[1].super_ParsedExpression.super_BaseExpression.alias._M_dataplus._M_p -
                 *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type)) {
    __n = 1;
    do {
      ExpressionTypeToOperator_abi_cxx11_
                (&local_50,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type
                 ,(ExpressionType)lVar9);
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1f535a1);
      local_80 = &local_70;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_70 = *plVar7;
        lStack_68 = plVar5[3];
      }
      else {
        local_70 = *plVar7;
        local_80 = (long *)*plVar5;
      }
      local_78 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_80);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_d0 = *puVar8;
        lStack_c8 = plVar5[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *puVar8;
        local_e0 = (ulong *)*plVar5;
      }
      local_d8 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)local_58,__n);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_a0,pEVar4);
      uVar10 = 0xf;
      if (local_e0 != &local_d0) {
        uVar10 = local_d0;
      }
      if (uVar10 < (ulong)(local_98 + local_d8)) {
        uVar10 = 0xf;
        if (local_a0 != local_90) {
          uVar10 = local_90[0];
        }
        if (uVar10 < (ulong)(local_98 + local_d8)) goto LAB_01190f34;
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0);
      }
      else {
LAB_01190f34:
        puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0);
      }
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_f0 = *puVar1;
        uStack_e8 = puVar6[3];
        local_100 = &local_f0;
      }
      else {
        local_f0 = *puVar1;
        local_100 = (undefined8 *)*puVar6;
      }
      local_f8 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_100);
      lVar9 = extraout_RDX_00;
      if (local_100 != &local_f0) {
        operator_delete(local_100);
        lVar9 = extraout_RDX_01;
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
        lVar9 = extraout_RDX_02;
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0);
        lVar9 = extraout_RDX_03;
      }
      if (local_80 != &local_70) {
        operator_delete(local_80);
        lVar9 = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        lVar9 = extraout_RDX_05;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)this[1].super_ParsedExpression.super_BaseExpression.alias.
                                 _M_dataplus._M_p -
                           *(long *)&this[1].super_ParsedExpression.super_BaseExpression.type >> 3))
    ;
  }
  psVar2 = local_60;
  (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_60,local_c0,local_b8 + (long)local_c0)
  ;
  ::std::__cxx11::string::append((char *)psVar2);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  return psVar2;
}

Assistant:

static string ToString(const T &entry) {
		string result = "(" + entry.children[0]->ToString();
		for (idx_t i = 1; i < entry.children.size(); i++) {
			result += " " + ExpressionTypeToOperator(entry.GetExpressionType()) + " " + entry.children[i]->ToString();
		}
		return result + ")";
	}